

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TDeletingArray<FVoxel_*,_FVoxel_*>::~TDeletingArray(TDeletingArray<FVoxel_*,_FVoxel_*> *this)

{
  FVoxel *this_00;
  uint uVar1;
  FVoxel **ppFVar2;
  uint local_14;
  uint i;
  TDeletingArray<FVoxel_*,_FVoxel_*> *this_local;
  
  for (local_14 = 0;
      uVar1 = TArray<FVoxel_*,_FVoxel_*>::Size(&this->super_TArray<FVoxel_*,_FVoxel_*>),
      local_14 < uVar1; local_14 = local_14 + 1) {
    ppFVar2 = TArray<FVoxel_*,_FVoxel_*>::operator[]
                        (&this->super_TArray<FVoxel_*,_FVoxel_*>,(ulong)local_14);
    if (*ppFVar2 != (FVoxel *)0x0) {
      ppFVar2 = TArray<FVoxel_*,_FVoxel_*>::operator[]
                          (&this->super_TArray<FVoxel_*,_FVoxel_*>,(ulong)local_14);
      this_00 = *ppFVar2;
      if (this_00 != (FVoxel *)0x0) {
        FVoxel::~FVoxel(this_00);
        operator_delete(this_00,0x158);
      }
    }
  }
  TArray<FVoxel_*,_FVoxel_*>::~TArray(&this->super_TArray<FVoxel_*,_FVoxel_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}